

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

int ptls_compare_separator_line(char *line,char *begin_or_end,char *label)

{
  size_t sVar1;
  size_t label_length;
  size_t begin_or_end_length;
  size_t text_index;
  int ret;
  char *label_local;
  char *begin_or_end_local;
  char *line_local;
  
  text_index._4_4_ = strncmp(line,"-----",5);
  begin_or_end_length = 5;
  if (text_index._4_4_ == 0) {
    sVar1 = strlen(begin_or_end);
    text_index._4_4_ = strncmp(line + 5,begin_or_end,sVar1);
    begin_or_end_length = sVar1 + 5;
  }
  if (text_index._4_4_ == 0) {
    text_index._4_4_ = line[begin_or_end_length] + -0x20;
    begin_or_end_length = begin_or_end_length + 1;
  }
  if (text_index._4_4_ == 0) {
    sVar1 = strlen(label);
    text_index._4_4_ = strncmp(line + begin_or_end_length,label,sVar1);
    begin_or_end_length = sVar1 + begin_or_end_length;
  }
  if (text_index._4_4_ == 0) {
    text_index._4_4_ = strncmp(line + begin_or_end_length,"-----",5);
  }
  return text_index._4_4_;
}

Assistant:

static int ptls_compare_separator_line(const char *line, const char *begin_or_end, const char *label)
{
    int ret = strncmp(line, "-----", 5);
    size_t text_index = 5;

    if (ret == 0) {
        size_t begin_or_end_length = strlen(begin_or_end);
        ret = strncmp(line + text_index, begin_or_end, begin_or_end_length);
        text_index += begin_or_end_length;
    }

    if (ret == 0) {
        ret = line[text_index] - ' ';
        text_index++;
    }

    if (ret == 0) {
        size_t label_length = strlen(label);
        ret = strncmp(line + text_index, label, label_length);
        text_index += label_length;
    }

    if (ret == 0) {
        ret = strncmp(line + text_index, "-----", 5);
    }

    return ret;
}